

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O0

void __thiscall
cppcms::impl::response_headers::
format_http_headers<cppcms::impl::response_headers::string_buffer_wrapper>
          (response_headers *this,string_buffer_wrapper *io,char *http_version,bool complete)

{
  bool bVar1;
  byte in_CL;
  string_buffer_wrapper *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *h;
  const_iterator __end3;
  const_iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  const_iterator e;
  const_iterator p;
  const_iterator status_ptr;
  string *in_stack_ffffffffffffff28;
  string_buffer_wrapper *in_stack_ffffffffffffff30;
  _Self local_90;
  _Self local_88;
  long local_80;
  _Self local_78;
  _Self local_70;
  _Self local_68 [3];
  allocator local_49;
  string local_48 [32];
  _Self local_28;
  byte local_19;
  string_buffer_wrapper *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Status",&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_ffffffffffffff28,(key_type *)0x38082e);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffff28);
  bVar1 = std::operator==(&local_28,local_68);
  if (bVar1) {
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3808f6);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  local_70._M_node =
       (_Base_ptr)
       std::
       begin<std::map<std::__cxx11::string,std::__cxx11::string,cppcms::impl::icompare_type,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff28);
  local_78._M_node =
       (_Base_ptr)
       std::
       end<std::map<std::__cxx11::string,std::__cxx11::string,cppcms::impl::icompare_type,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff28);
  while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
    bVar1 = std::operator!=(&local_70,&local_28);
    if (bVar1) {
      in_stack_ffffffffffffff30 = local_10;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x380980);
      string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28)
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x3809ab);
      string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28)
      ;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff30);
  }
  local_80 = in_RDI + 0x30;
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff28);
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff28);
  while (bVar1 = std::operator!=(&local_88,&local_90), bVar1) {
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffff30);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_88);
  }
  if ((local_19 & 1) != 0) {
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

void format_http_headers(IODevice &io,char const *http_version,bool complete) const
	{
		io << "HTTP/" << http_version << " ";;
		auto status_ptr = headers_.find("Status");
		if(status_ptr == headers_.end()) {
			io << "200 Ok";
		}
		else {
			io << status_ptr->second;
		}
		io << "\r\n";
		for(auto p=std::begin(headers_),e=std::end(headers_);p!=e;++p) {
			if(p!=status_ptr)
				io << p->first << ": " << p->second << "\r\n";
		}
		for(auto const &h: added_headers_) {
			io <<  h << "\r\n" ;
		}
		if(complete)
			io << "\r\n";
	}